

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int aom_noise_strength_solver_fit_piecewise
              (aom_noise_strength_solver_t *solver,int max_output_points,
              aom_noise_strength_lut_t *lut)

{
  double dVar1;
  int iVar2;
  double (*padVar3) [2];
  uint uVar4;
  ulong uVar5;
  int iVar6;
  double *residual;
  uint uVar7;
  long lVar8;
  int start;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  dVar1 = solver->max_intensity;
  iVar6 = aom_noise_strength_lut_init(lut,solver->num_bins);
  if (iVar6 == 0) {
    fwrite("Failed to init lut\n",0x13,1,_stderr);
  }
  else {
    uVar7 = solver->num_bins;
    uVar9 = 0;
    uVar10 = 0;
    if (0 < (int)uVar7) {
      uVar10 = (ulong)uVar7;
    }
    lVar8 = 8;
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      dVar11 = aom_noise_strength_solver_get_center(solver,(int)uVar9);
      padVar3 = lut->points;
      *(double *)((long)padVar3[-1] + lVar8 + 8) = dVar11;
      *(double *)((long)*padVar3 + lVar8) = (solver->eqns).x[uVar9];
      lVar8 = lVar8 + 0x10;
    }
    uVar4 = uVar7;
    if (-1 < max_output_points) {
      uVar4 = max_output_points;
    }
    residual = (double *)aom_malloc((long)(int)uVar7 << 3);
    if (residual != (double *)0x0) {
      memset(residual,0,(long)solver->num_bins << 3);
      iVar6 = solver->num_bins;
      start = 0;
      while( true ) {
        update_piecewise_linear_residual(solver,lut,residual,start,iVar6);
        iVar2 = lut->num_points;
        if (iVar2 < 3) break;
        uVar9 = 1;
        uVar10 = 1;
        while( true ) {
          uVar7 = (uint)uVar10;
          if (iVar2 - 1 == uVar9) break;
          uVar5 = uVar9;
          if (residual[(int)uVar7] < residual[uVar9] || residual[(int)uVar7] == residual[uVar9]) {
            uVar5 = uVar10;
          }
          uVar10 = uVar5 & 0xffffffff;
          uVar9 = uVar9 + 1;
        }
        iVar6 = uVar7 + 1;
        start = uVar7 - 1;
        padVar3 = lut->points;
        if ((iVar2 <= (int)uVar4) &&
           ((dVar1 * 0.00625) / 255.0 <
            residual[(int)uVar7] / (padVar3[iVar6][0] - padVar3[start][0]))) break;
        memmove(padVar3 + (int)uVar7,padVar3 + (long)(int)uVar7 + 1,(long)(int)(iVar2 + ~uVar7) << 4
               );
        lut->num_points = lut->num_points + -1;
      }
      aom_free(residual);
      return 1;
    }
    aom_noise_strength_lut_free(lut);
  }
  return 0;
}

Assistant:

int aom_noise_strength_solver_fit_piecewise(
    const aom_noise_strength_solver_t *solver, int max_output_points,
    aom_noise_strength_lut_t *lut) {
  // The tolerance is normalized to be give consistent results between
  // different bit-depths.
  const double kTolerance = solver->max_intensity * 0.00625 / 255.0;
  if (!aom_noise_strength_lut_init(lut, solver->num_bins)) {
    fprintf(stderr, "Failed to init lut\n");
    return 0;
  }
  for (int i = 0; i < solver->num_bins; ++i) {
    lut->points[i][0] = aom_noise_strength_solver_get_center(solver, i);
    lut->points[i][1] = solver->eqns.x[i];
  }
  if (max_output_points < 0) {
    max_output_points = solver->num_bins;
  }

  double *residual = (double *)aom_malloc(solver->num_bins * sizeof(*residual));
  if (!residual) {
    aom_noise_strength_lut_free(lut);
    return 0;
  }
  memset(residual, 0, sizeof(*residual) * solver->num_bins);

  update_piecewise_linear_residual(solver, lut, residual, 0, solver->num_bins);

  // Greedily remove points if there are too many or if it doesn't hurt local
  // approximation (never remove the end points)
  while (lut->num_points > 2) {
    int min_index = 1;
    for (int j = 1; j < lut->num_points - 1; ++j) {
      if (residual[j] < residual[min_index]) {
        min_index = j;
      }
    }
    const double dx =
        lut->points[min_index + 1][0] - lut->points[min_index - 1][0];
    const double avg_residual = residual[min_index] / dx;
    if (lut->num_points <= max_output_points && avg_residual > kTolerance) {
      break;
    }

    const int num_remaining = lut->num_points - min_index - 1;
    memmove(lut->points + min_index, lut->points + min_index + 1,
            sizeof(lut->points[0]) * num_remaining);
    lut->num_points--;

    update_piecewise_linear_residual(solver, lut, residual, min_index - 1,
                                     min_index + 1);
  }
  aom_free(residual);
  return 1;
}